

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_MSR_reg(DisasContext_conflict1 *s,arg_MSR_reg *a)

{
  uint32_t mask;
  int iVar1;
  TCGv_i32 t0;
  uint uVar2;
  
  uVar2 = (uint)s->features;
  if ((uVar2 >> 9 & 1) == 0) {
    mask = msr_mask(s,a->mask,a->r);
    t0 = load_reg(s,a->rn);
    iVar1 = gen_set_psr(s,mask,a->r,t0);
    if (iVar1 != 0) {
      unallocated_encoding_aarch64(s);
    }
  }
  return (uVar2 >> 9 & 1) == 0;
}

Assistant:

static bool trans_MSR_reg(DisasContext *s, arg_MSR_reg *a)
{
    TCGv_i32 tmp;
    uint32_t mask = msr_mask(s, a->mask, a->r);

    if (arm_dc_feature(s, ARM_FEATURE_M)) {
        return false;
    }
    tmp = load_reg(s, a->rn);
    if (gen_set_psr(s, mask, a->r, tmp)) {
        unallocated_encoding(s);
    }
    return true;
}